

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O0

bool __thiscall
QSystemSemaphorePosix::handle
          (QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self,AccessMode mode)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  sem_t *psVar4;
  int *piVar5;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int maxTries;
  int tryNum;
  int oflag;
  undefined1 in_stack_000000b0 [16];
  QByteArray semName;
  undefined4 in_stack_fffffffffffffed8;
  SystemSemaphoreError in_stack_fffffffffffffedc;
  QSystemSemaphorePrivate *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  QLatin1String *in_stack_fffffffffffffef0;
  QString *in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff30 [16];
  QChar fillChar;
  int local_bc;
  int iVar6;
  uint __oflag;
  bool local_83;
  QChar local_82;
  QLatin1StringView local_80;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  fillChar.ucs = in_stack_ffffffffffffff30._14_2_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QNativeIpcKey::nativeKey
              ((QNativeIpcKey *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QFile::encodeName((QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QString::~QString((QString *)0x8d47ef);
    bVar1 = QByteArray::isEmpty((QByteArray *)0x8d47fc);
    if (bVar1) {
      QSystemSemaphore::tr
                ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      local_80 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            (size_t)in_stack_fffffffffffffee0);
      QChar::QChar<char16_t,_true>(&local_82,L' ');
      QString::arg<QLatin1String,_true>
                (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                 fillChar);
      QSystemSemaphorePrivate::setError
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,(QString *)0x8d48a5);
      QString::~QString((QString *)0x8d48b4);
      QString::~QString((QString *)0x8d48c1);
      local_83 = false;
    }
    else {
      __oflag = 0xc0;
      local_bc = 1;
      for (iVar6 = 0; iVar6 < local_bc; iVar6 = iVar6 + 1) {
        do {
          pcVar3 = QByteArray::constData((QByteArray *)0x8d4997);
          psVar4 = sem_open(pcVar3,__oflag,0x180,(ulong)*(uint *)(in_RSI + 0x40));
          *in_RDI = (long)psVar4;
          bVar1 = false;
          if (*in_RDI == 0) {
            piVar5 = __errno_location();
            bVar1 = *piVar5 == 4;
          }
        } while (bVar1);
        if ((*in_RDI != 0) || (piVar5 = __errno_location(), *piVar5 != 0x11)) break;
        if (in_EDX == 1) {
          pcVar3 = QByteArray::constData((QByteArray *)0x8d4a20);
          iVar2 = sem_unlink(pcVar3);
          if ((iVar2 == -1) && (piVar5 = __errno_location(), *piVar5 != 2)) {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       (size_t)in_stack_fffffffffffffee0);
            QSystemSemaphorePrivate::setUnixErrorString
                      ((QSystemSemaphorePrivate *)CONCAT44(__oflag,iVar6),
                       (QLatin1StringView)in_stack_000000b0);
            local_83 = false;
            goto LAB_008d4b45;
          }
          local_bc = 3;
        }
        else {
          __oflag = __oflag & 0xffffff7f;
          local_bc = 2;
        }
      }
      if (*in_RDI == 0) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (size_t)in_stack_fffffffffffffee0);
        QSystemSemaphorePrivate::setUnixErrorString
                  ((QSystemSemaphorePrivate *)CONCAT44(__oflag,iVar6),
                   (QLatin1StringView)in_stack_000000b0);
        local_83 = false;
      }
      else {
        *(bool *)(in_RDI + 1) = (__oflag & 0x80) != 0;
        local_83 = true;
      }
    }
LAB_008d4b45:
    QByteArray::~QByteArray((QByteArray *)0x8d4b52);
  }
  else {
    local_83 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_83;
}

Assistant:

bool QSystemSemaphorePosix::handle(QSystemSemaphorePrivate *self, QSystemSemaphore::AccessMode mode)
{
    if (semaphore != SEM_FAILED)
        return true;  // we already have a semaphore

    const QByteArray semName = QFile::encodeName(self->nativeKey.nativeKey());
    if (semName.isEmpty()) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: key is empty")
                       .arg("QSystemSemaphore::handle"_L1));
        return false;
    }

    // Always try with O_EXCL so we know whether we created the semaphore.
    int oflag = O_CREAT | O_EXCL;
    for (int tryNum = 0, maxTries = 1; tryNum < maxTries; ++tryNum) {
        do {
            semaphore = ::sem_open(semName.constData(), oflag, 0600, self->initialValue);
        } while (semaphore == SEM_FAILED && errno == EINTR);
        if (semaphore == SEM_FAILED && errno == EEXIST) {
            if (mode == QSystemSemaphore::Create) {
                if (::sem_unlink(semName.constData()) == -1 && errno != ENOENT) {
                    self->setUnixErrorString("QSystemSemaphore::handle (sem_unlink)"_L1);
                    return false;
                }
                // Race condition: the semaphore might be recreated before
                // we call sem_open again, so we'll retry several times.
                maxTries = 3;
            } else {
                // Race condition: if it no longer exists at the next sem_open
                // call, we won't realize we created it, so we'll leak it later.
                oflag &= ~O_EXCL;
                maxTries = 2;
            }
        } else {
            break;
        }
    }

    if (semaphore == SEM_FAILED) {
        self->setUnixErrorString("QSystemSemaphore::handle"_L1);
        return false;
    }

    createdSemaphore = (oflag & O_EXCL) != 0;

    return true;
}